

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::prepend(Buffer *this,char *buf,off_t len)

{
  char *pcVar1;
  off_t oVar2;
  off_t oVar3;
  off_t oVar4;
  Buffer local_40;
  
  if ((buf != (char *)0x0) && (0 < len)) {
    if (this->leftIndex_ < len) {
      oVar4 = size(this);
      if (this->capacity_ < oVar4 + len) {
        oVar4 = size(this);
        Buffer(&local_40,oVar4 + len);
        append(&local_40,this);
        pcVar1 = this->buffer_;
        this->buffer_ = local_40.buffer_;
        oVar2 = this->leftIndex_;
        oVar3 = this->rightIndex_;
        this->leftIndex_ = local_40.leftIndex_;
        this->rightIndex_ = local_40.rightIndex_;
        oVar4 = this->capacity_;
        this->capacity_ = local_40.capacity_;
        local_40.buffer_ = pcVar1;
        local_40.leftIndex_ = oVar2;
        local_40.rightIndex_ = oVar3;
        local_40.capacity_ = oVar4;
        resetBuffer(&local_40);
      }
      else {
        backward(this,len - this->leftIndex_);
      }
    }
    safePreappend(this,buf,len);
    return;
  }
  __assert_fail("buf && len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x8f,"void Liby::Buffer::prepend(const char *, off_t)");
}

Assistant:

void Buffer::prepend(const char *buf, off_t len) {
    assert(buf && len > 0);
    if (leftIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        backward(len - leftIndex_);
    } else {
        Buffer nb(len + size());
        nb.append(*this);
        swap(nb);
    }
    safePreappend(buf, len);
}